

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAbbrev.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFAbbreviationDeclarationSet::extract
          (DWARFAbbreviationDeclarationSet *this,DataExtractor Data,uint64_t *OffsetPtr)

{
  OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true> OVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined1 local_d8 [8];
  DWARFAbbreviationDeclaration AbbrDecl;
  
  this->Offset = 0;
  this->FirstAbbrCode = 0;
  std::
  vector<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>::
  clear(&this->Decls);
  AbbrDecl.FixedAttributeSize.Storage =
       (OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>)*OffsetPtr;
  this->Offset = (uint64_t)AbbrDecl.FixedAttributeSize.Storage;
  DWARFAbbreviationDeclaration::DWARFAbbreviationDeclaration
            ((DWARFAbbreviationDeclaration *)local_d8);
  uVar4 = 0;
  do {
    bVar2 = DWARFAbbreviationDeclaration::extract
                      ((DWARFAbbreviationDeclaration *)local_d8,Data,OffsetPtr);
    if (!bVar2) {
      OVar1 = (OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>)*OffsetPtr;
      if ((uint *)AbbrDecl._0_8_ !=
          &AbbrDecl.AttributeSpecs.
           super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
           super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>.
           super_SmallVectorBase.Size) {
        free((void *)AbbrDecl._0_8_);
      }
      return AbbrDecl.FixedAttributeSize.Storage != OVar1;
    }
    uVar3 = local_d8._0_4_;
    if (this->FirstAbbrCode == 0) {
LAB_00d5ccaf:
      this->FirstAbbrCode = uVar3;
      uVar4 = local_d8._0_4_;
    }
    else {
      uVar4 = uVar4 + 1;
      uVar3 = 0xffffffff;
      if (uVar4 != local_d8._0_4_) goto LAB_00d5ccaf;
    }
    std::
    vector<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>
    ::emplace_back<llvm::DWARFAbbreviationDeclaration>
              (&this->Decls,(DWARFAbbreviationDeclaration *)local_d8);
  } while( true );
}

Assistant:

bool DWARFAbbreviationDeclarationSet::extract(DataExtractor Data,
                                              uint64_t *OffsetPtr) {
  clear();
  const uint64_t BeginOffset = *OffsetPtr;
  Offset = BeginOffset;
  DWARFAbbreviationDeclaration AbbrDecl;
  uint32_t PrevAbbrCode = 0;
  while (AbbrDecl.extract(Data, OffsetPtr)) {
    if (FirstAbbrCode == 0) {
      FirstAbbrCode = AbbrDecl.getCode();
    } else {
      if (PrevAbbrCode + 1 != AbbrDecl.getCode()) {
        // Codes are not consecutive, can't do O(1) lookups.
        FirstAbbrCode = UINT32_MAX;
      }
    }
    PrevAbbrCode = AbbrDecl.getCode();
    Decls.push_back(std::move(AbbrDecl));
  }
  return BeginOffset != *OffsetPtr;
}